

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::LogSoftmax::backward_impl
          (LogSoftmax *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  PointerType pfVar1;
  Tensor *pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  runtime_error *this_00;
  char *__function;
  PointerType pfVar8;
  long lVar9;
  variable_if_dynamic<long,__1> vVar10;
  ulong uVar11;
  variable_if_dynamic<long,__1> vVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 extraout_var [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_a8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_88;
  undefined1 local_68 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"LogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Tensor::operator*(&local_88,fx);
  Tensor::operator*(&local_a8,dEdf);
  if ((local_88.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_a8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_a8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    if (local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value == 0 ||
        local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value == 0) {
      local_68 = ZEXT816(0) << 0x40;
    }
    else {
      if ((local_a8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value < 1) ||
         (local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value < 1)) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<cnn::FWeightedError, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<cnn::FWeightedError, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                     );
      }
      auVar25 = ZEXT464((uint)*local_a8.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_data);
      if (local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value != 1) {
        auVar15 = vpbroadcastq_avx512f();
        uVar11 = 0;
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),
                                    *local_a8.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_data));
        do {
          auVar22 = auVar25;
          auVar25 = vpbroadcastq_avx512f();
          auVar18 = vporq_avx512f(auVar25,auVar16);
          auVar25 = vporq_avx512f(auVar25,auVar17);
          uVar5 = vpcmpuq_avx512f(auVar25,auVar15,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar18,auVar15,2);
          bVar7 = (byte)uVar5;
          uVar13 = CONCAT11(bVar7,bVar6);
          pfVar8 = local_a8.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data + uVar11 + 1;
          auVar25._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar8[1];
          auVar25._0_4_ = (uint)(bVar6 & 1) * (int)*pfVar8;
          auVar25._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar8[2];
          auVar25._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar8[3];
          auVar25._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar8[4];
          auVar25._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar8[5];
          auVar25._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar8[6];
          auVar25._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * (int)pfVar8[7];
          auVar25._32_4_ = (uint)(bVar7 & 1) * (int)pfVar8[8];
          auVar25._36_4_ = (uint)(bVar7 >> 1 & 1) * (int)pfVar8[9];
          auVar25._40_4_ = (uint)(bVar7 >> 2 & 1) * (int)pfVar8[10];
          auVar25._44_4_ = (uint)(bVar7 >> 3 & 1) * (int)pfVar8[0xb];
          auVar25._48_4_ = (uint)(bVar7 >> 4 & 1) * (int)pfVar8[0xc];
          auVar25._52_4_ = (uint)(bVar7 >> 5 & 1) * (int)pfVar8[0xd];
          auVar25._56_4_ = (uint)(bVar7 >> 6 & 1) * (int)pfVar8[0xe];
          auVar25._60_4_ = (uint)(bVar7 >> 7) * (int)pfVar8[0xf];
          auVar25 = vaddps_avx512f(auVar25,auVar22);
          uVar11 = uVar11 + 0x10;
        } while ((local_a8.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value + 0xeU & 0xfffffffffffffff0) != uVar11);
        auVar15._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar22._0_4_
        ;
        bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar15._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar22._4_4_;
        bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar15._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar22._8_4_;
        bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar15._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar22._12_4_;
        bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar15._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar22._16_4_;
        bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar15._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar22._20_4_;
        bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar15._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar22._24_4_;
        bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
        auVar15._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar22._28_4_;
        auVar15._32_4_ =
             (uint)(bVar7 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._32_4_;
        bVar3 = (bool)(bVar7 >> 1 & 1);
        auVar15._36_4_ = (uint)bVar3 * auVar25._36_4_ | (uint)!bVar3 * auVar22._36_4_;
        bVar3 = (bool)(bVar7 >> 2 & 1);
        auVar15._40_4_ = (uint)bVar3 * auVar25._40_4_ | (uint)!bVar3 * auVar22._40_4_;
        bVar3 = (bool)(bVar7 >> 3 & 1);
        auVar15._44_4_ = (uint)bVar3 * auVar25._44_4_ | (uint)!bVar3 * auVar22._44_4_;
        bVar3 = (bool)(bVar7 >> 4 & 1);
        auVar15._48_4_ = (uint)bVar3 * auVar25._48_4_ | (uint)!bVar3 * auVar22._48_4_;
        bVar3 = (bool)(bVar7 >> 5 & 1);
        auVar15._52_4_ = (uint)bVar3 * auVar25._52_4_ | (uint)!bVar3 * auVar22._52_4_;
        bVar3 = (bool)(bVar7 >> 6 & 1);
        auVar15._56_4_ = (uint)bVar3 * auVar25._56_4_ | (uint)!bVar3 * auVar22._56_4_;
        auVar15._60_4_ =
             (uint)(bVar7 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar22._60_4_;
        auVar14 = vextractf64x4_avx512f(auVar15,1);
        auVar25 = vaddps_avx512f(auVar15,ZEXT3264(auVar14));
        auVar20._0_4_ = auVar25._0_4_ + auVar25._16_4_;
        auVar20._4_4_ = auVar25._4_4_ + auVar25._20_4_;
        auVar20._8_4_ = auVar25._8_4_ + auVar25._24_4_;
        auVar20._12_4_ = auVar25._12_4_ + auVar25._28_4_;
        auVar4 = vshufpd_avx(auVar20,auVar20,1);
        auVar21._0_4_ = auVar20._0_4_ + auVar4._0_4_;
        auVar21._4_4_ = auVar20._4_4_ + auVar4._4_4_;
        auVar21._8_4_ = auVar20._8_4_ + auVar4._8_4_;
        auVar21._12_4_ = auVar20._12_4_ + auVar4._12_4_;
        auVar4 = vhaddps_avx(auVar21,auVar21);
        auVar25 = ZEXT1664(auVar4);
      }
      local_68 = auVar25._0_16_;
      if (local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != 1) {
        lVar9 = 1;
        vVar12.m_value = 1;
        if (1 < local_a8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value) {
          vVar12.m_value =
               local_a8.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
        }
        vVar10.m_value = 2;
        if (2 < local_a8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value) {
          vVar10.m_value =
               local_a8.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
        }
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        pfVar8 = local_a8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
        do {
          pfVar8 = pfVar8 + local_a8.
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_rows.m_value;
          uVar11 = 0;
          auVar25 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),auVar25._0_4_));
          do {
            auVar22 = auVar25;
            auVar25 = vpbroadcastq_avx512f();
            auVar18 = vporq_avx512f(auVar25,auVar16);
            auVar25 = vporq_avx512f(auVar25,auVar17);
            uVar5 = vpcmpuq_avx512f(auVar25,auVar15,2);
            bVar6 = (byte)uVar5;
            uVar5 = vpcmpuq_avx512f(auVar18,auVar15,2);
            bVar7 = (byte)uVar5;
            uVar13 = CONCAT11(bVar7,bVar6);
            pfVar1 = pfVar8 + uVar11;
            auVar18._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar1[1];
            auVar18._0_4_ = (uint)(bVar6 & 1) * (int)*pfVar1;
            auVar18._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar1[2];
            auVar18._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar1[3];
            auVar18._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar1[4];
            auVar18._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar1[5];
            auVar18._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar1[6];
            auVar18._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * (int)pfVar1[7];
            auVar18._32_4_ = (uint)(bVar7 & 1) * (int)pfVar1[8];
            auVar18._36_4_ = (uint)(bVar7 >> 1 & 1) * (int)pfVar1[9];
            auVar18._40_4_ = (uint)(bVar7 >> 2 & 1) * (int)pfVar1[10];
            auVar18._44_4_ = (uint)(bVar7 >> 3 & 1) * (int)pfVar1[0xb];
            auVar18._48_4_ = (uint)(bVar7 >> 4 & 1) * (int)pfVar1[0xc];
            auVar18._52_4_ = (uint)(bVar7 >> 5 & 1) * (int)pfVar1[0xd];
            auVar18._56_4_ = (uint)(bVar7 >> 6 & 1) * (int)pfVar1[0xe];
            auVar18._60_4_ = (uint)(bVar7 >> 7) * (int)pfVar1[0xf];
            auVar25 = vaddps_avx512f(auVar18,auVar22);
            uVar11 = uVar11 + 0x10;
          } while ((vVar12.m_value + 0xfU & 0xfffffffffffffff0) != uVar11);
          auVar19._0_4_ =
               (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar22._0_4_;
          bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar19._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar22._4_4_;
          bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar19._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar22._8_4_;
          bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar19._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar22._12_4_;
          bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar19._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar22._16_4_;
          bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar19._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar22._20_4_;
          bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar19._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar22._24_4_;
          bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar19._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar22._28_4_;
          auVar19._32_4_ =
               (uint)(bVar7 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._32_4_;
          bVar3 = (bool)(bVar7 >> 1 & 1);
          auVar19._36_4_ = (uint)bVar3 * auVar25._36_4_ | (uint)!bVar3 * auVar22._36_4_;
          bVar3 = (bool)(bVar7 >> 2 & 1);
          auVar19._40_4_ = (uint)bVar3 * auVar25._40_4_ | (uint)!bVar3 * auVar22._40_4_;
          bVar3 = (bool)(bVar7 >> 3 & 1);
          auVar19._44_4_ = (uint)bVar3 * auVar25._44_4_ | (uint)!bVar3 * auVar22._44_4_;
          bVar3 = (bool)(bVar7 >> 4 & 1);
          auVar19._48_4_ = (uint)bVar3 * auVar25._48_4_ | (uint)!bVar3 * auVar22._48_4_;
          bVar3 = (bool)(bVar7 >> 5 & 1);
          auVar19._52_4_ = (uint)bVar3 * auVar25._52_4_ | (uint)!bVar3 * auVar22._52_4_;
          bVar3 = (bool)(bVar7 >> 6 & 1);
          auVar19._56_4_ = (uint)bVar3 * auVar25._56_4_ | (uint)!bVar3 * auVar22._56_4_;
          auVar19._60_4_ =
               (uint)(bVar7 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar22._60_4_;
          auVar14 = vextractf64x4_avx512f(auVar19,1);
          auVar25 = vaddps_avx512f(auVar19,ZEXT3264(auVar14));
          auVar23._0_4_ = auVar25._0_4_ + auVar25._16_4_;
          auVar23._4_4_ = auVar25._4_4_ + auVar25._20_4_;
          auVar23._8_4_ = auVar25._8_4_ + auVar25._24_4_;
          auVar23._12_4_ = auVar25._12_4_ + auVar25._28_4_;
          auVar4 = vshufpd_avx(auVar23,auVar23,1);
          auVar24._0_4_ = auVar23._0_4_ + auVar4._0_4_;
          auVar24._4_4_ = auVar23._4_4_ + auVar4._4_4_;
          auVar24._8_4_ = auVar23._8_4_ + auVar4._8_4_;
          auVar24._12_4_ = auVar23._12_4_ + auVar4._12_4_;
          local_68 = vhaddps_avx(auVar24,auVar24);
          auVar25 = ZEXT1664(local_68);
          lVar9 = lVar9 + 1;
        } while (lVar9 != vVar10.m_value);
      }
    }
    Tensor::operator*(&local_88,fx);
    Tensor::operator*(&local_a8,dEdf);
    if ((local_88.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value ==
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) &&
       (local_88.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value ==
        local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
      Tensor::operator*(&local_50,dEdxi);
      if ((local_50.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value ==
           local_a8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) &&
         (local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value ==
          local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
        if (0 < local_50.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value *
                local_50.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value) {
          lVar9 = 0;
          do {
            auVar16._0_4_ =
                 expf(local_88.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[lVar9]);
            auVar16._4_60_ = extraout_var;
            auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(local_50.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[lVar9] +
                                                  local_a8.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[lVar9])),auVar16._0_16_,
                                      ZEXT416((uint)local_68._0_4_));
            local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data[lVar9] = auVar4._0_4_;
            lVar9 = lVar9 + 1;
          } while (local_50.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value *
                   local_50.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value - lVar9 != 0);
        }
        return;
      }
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FLogSoftmaxBackward, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                   );
    }
    __function = 
    "Eigen::CwiseBinaryOp<cnn::FLogSoftmaxBackward, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FLogSoftmaxBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
    ;
  }
  else {
    __function = 
    "Eigen::CwiseBinaryOp<cnn::FWeightedError, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FWeightedError, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
    ;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void LogSoftmax::backward_impl(const vector<const Tensor*>& xs,
                          const Tensor& fx,
                          const Tensor& dEdf,
                          unsigned i,
                          Tensor& dEdxi) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    throw std::runtime_error("LogSoftmax::backward not yet implemented for CUDA");
#else
    float off_diag_sum = -(*fx).binaryExpr(*dEdf, FWeightedError()).sum();
    *dEdxi += (*fx).binaryExpr(*dEdf, FLogSoftmaxBackward(off_diag_sum));
#endif
  } else {
    throw std::runtime_error("LogSoftmax::backward not yet implemented for multiple columns");
  }
}